

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O0

void __thiscall
irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::parseComment
          (CXMLReaderImpl<char,_irr::io::IXMLBase> *this)

{
  string<char> local_30;
  int local_1c;
  char *pcStack_18;
  int count;
  char *pCommentBegin;
  CXMLReaderImpl<char,_irr::io::IXMLBase> *this_local;
  
  this->CurrentNodeType = EXN_COMMENT;
  this->P = this->P + 1;
  pcStack_18 = this->P;
  local_1c = 1;
  while (local_1c != 0) {
    if (*this->P == '>') {
      local_1c = local_1c + -1;
    }
    else if (*this->P == '<') {
      local_1c = local_1c + 1;
    }
    this->P = this->P + 1;
  }
  this->P = this->P + -3;
  pCommentBegin = (char *)this;
  core::string<char>::string<char>
            (&local_30,pcStack_18 + 2,(*(int *)&this->P - (int)pcStack_18) + -2);
  core::string<char>::operator=(&this->NodeName,&local_30);
  core::string<char>::~string(&local_30);
  this->P = this->P + 3;
  return;
}

Assistant:

void parseComment()
	{
		CurrentNodeType = EXN_COMMENT;
		P += 1;

		char_type *pCommentBegin = P;

		int count = 1;

		// move until end of comment reached
		while(count)
		{
			if (*P == L'>')
				--count;
			else
			if (*P == L'<')
				++count;

			++P;
		}

		P -= 3;
		NodeName = core::string<char_type>(pCommentBegin+2, (int)(P - pCommentBegin-2));
		P += 3;
	}